

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Atom.cpp
# Opt level: O2

vector<Data_*,_std::allocator<Data_*>_> * __thiscall
Bracket::genParaData(Bracket *this,Runtime *runtime)

{
  vector<Data_*,_std::allocator<Data_*>_> *this_00;
  undefined8 uVar1;
  long lVar2;
  _List_node_base *p_Var3;
  allocator_type local_29;
  
  this_00 = (vector<Data_*,_std::allocator<Data_*>_> *)operator_new(0x18);
  std::vector<Data_*,_std::allocator<Data_*>_>::vector
            (this_00,(this->para).super__List_base<Atom_*,_std::allocator<Atom_*>_>._M_impl._M_node.
                     _M_size,&local_29);
  lVar2 = 0;
  p_Var3 = (_List_node_base *)&this->para;
  while (p_Var3 = (((_List_base<Atom_*,_std::allocator<Atom_*>_> *)&p_Var3->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var3 != (_List_node_base *)&this->para) {
    uVar1 = (**(code **)(*(long *)p_Var3[1]._M_next + 0x18))(p_Var3[1]._M_next,runtime);
    *(undefined8 *)
     ((long)(this_00->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
            super__Vector_impl_data._M_start + lVar2) = uVar1;
    lVar2 = lVar2 + 8;
  }
  return this_00;
}

Assistant:

std::vector<Data *> *Bracket::genParaData(Runtime *runtime) {
    auto result = new std::vector<Data *>(para.size());
    auto cursor = para.begin();
    auto i = 0;
    while (cursor != para.end()) {
        (*result)[i] = (*cursor)->eval(runtime);
        cursor++;
        i++;
    }
    return result;
}